

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

var __thiscall
cs::make_member_visitor<std::pair<cs_impl::any,cs_impl::any>>
          (cs *this,offset_in_pair<cs_impl::any,_cs_impl::any>_to_var member)

{
  cni local_20;
  types local_14;
  anon_class_8_1_60e67bd8 local_10;
  
  local_10.member = member;
  local_20.mCni =
       cs_impl::cni::
       construct_helper<cs::make_member_visitor<std::pair<cs_impl::any,cs_impl::any>>(cs_impl::any_std::pair<cs_impl::any,cs_impl::any>::*)::{lambda(std::pair<cs_impl::any,cs_impl::any>const&)#1}>
       ::
       construct<cs::make_member_visitor<std::pair<cs_impl::any,cs_impl::any>>(cs_impl::any_std::pair<cs_impl::any,cs_impl::any>::*)::_lambda(std::pair<cs_impl::any,cs_impl::any>const&)_1_>
                 (&local_10);
  local_14 = member_visitor;
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types>
            ((any *)this,&local_20,&local_14);
  if (local_20.mCni != (cni_holder_base *)0x0) {
    (*(local_20.mCni)->_vptr_cni_holder_base[1])();
  }
  return (var)(proxy *)this;
}

Assistant:

var make_member_visitor(var _Class::* member)
	{
		return var::make_protect<callable>(
		cni([member](const _Class &__this) {
			return __this.*member;
		}),
		cs::callable::types::member_visitor);
	}